

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasta_digest.cpp
# Opt level: O0

uint patternToCode(StringBuffer *pattern)

{
  char cVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ostream *poVar4;
  StringBuffer *in_RDI;
  int i;
  uint L;
  uint code;
  uint local_14;
  uint local_c;
  
  local_c = 0;
  uVar2 = StringBuffer::length(in_RDI);
  for (local_14 = 0; local_14 < (uint)uVar2; local_14 = local_14 + 1) {
    cVar1 = StringBuffer::getChar(in_RDI,(long)(int)local_14);
    local_c = (allowed_chars[cVar1] << ((byte)(local_14 << 1) & 0x1f)) + local_c;
  }
  pcVar3 = StringBuffer::getString(in_RDI);
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
  poVar4 = std::operator<<(poVar4,"=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return local_c;
}

Assistant:

unsigned patternToCode (const StringBuffer& pattern) {
    
    unsigned code = 0,
             L = pattern.length();
    
    for (int i = 0; i < L; i++) {
        code += allowed_chars[pattern.getChar (i)] << (2*i);
    }
    
    cout << pattern.getString() << "=" << code << endl;
    return code;
}